

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::init
          (ShaderFloatPrecisionCase *this,EVP_PKEY_CTX *ctx)

{
  Precision precision;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *log_00;
  char *evalOp;
  ShaderProgram *pSVar7;
  TestError *pTVar8;
  TestLog *log;
  Functions *gl;
  ShaderFloatPrecisionCase *this_local;
  long lVar6;
  
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  precision = this->m_precision;
  evalOp = (char *)std::__cxx11::string::c_str();
  pSVar7 = createFloatPrecisionEvalProgram(pRVar5,precision,evalOp,(bool)(this->m_isVertexCase & 1))
  ;
  this->m_program = pSVar7;
  glu::operator<<(log_00,this->m_program);
  do {
    dVar4 = ::deGetFalse();
    if (dVar4 != 0) {
LAB_01bc9c32:
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,"m_program->isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                 ,0xf9);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    bVar2 = glu::ShaderProgram::isOk(this->m_program);
    if (!bVar2) goto LAB_01bc9c32;
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_framebuffer);
  (**(code **)(lVar6 + 0x6e8))(1,&this->m_renderbuffer);
  (**(code **)(lVar6 + 0xa0))(0x8d41,this->m_renderbuffer);
  (**(code **)(lVar6 + 0x1238))(0x8d41,0x8236,0x20);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_framebuffer);
  (**(code **)(lVar6 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_renderbuffer);
  err = (**(code **)(lVar6 + 0x800))();
  glu::checkError(err,"Post framebuffer setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x105);
  while( true ) {
    dVar4 = ::deGetFalse();
    if (dVar4 != 0) break;
    iVar3 = (**(code **)(lVar6 + 0x170))(0x8d40);
    if (iVar3 != 0x8cd5) break;
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      pcVar1 = *(code **)(lVar6 + 0x78);
      pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      (*pRVar5->_vptr_RenderContext[6])();
      (*pcVar1)(0x8d40);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this->m_iterNdx = 0;
      return (int)this;
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
             ,0x106);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ShaderFloatPrecisionCase::init (void)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();
	TestLog&				log	= m_testCtx.getLog();

	DE_ASSERT(!m_program && !m_framebuffer && !m_renderbuffer);

	// Create program.
	m_program = createFloatPrecisionEvalProgram(m_context.getRenderContext(), m_precision, m_op.c_str(), m_isVertexCase);
	log << *m_program;

	TCU_CHECK(m_program->isOk());

	// Create framebuffer.
	gl.genFramebuffers(1, &m_framebuffer);
	gl.genRenderbuffers(1, &m_renderbuffer);

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Post framebuffer setup");
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());

	// Initialize test result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_iterNdx = 0;
}